

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distribution.hpp
# Opt level: O1

void mxx::
     stable_distribute<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
               (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                begin,__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                      end,
               __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
               out,comm *comm)

{
  uint uVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  void *pvVar4;
  int iVar5;
  long lVar6;
  unsigned_long uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  pointer puVar11;
  pointer puVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  size_t local_size;
  int result;
  custom_op<unsigned_long> op;
  allocator_type local_91;
  pointer local_90;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_88;
  custom_op<unsigned_long> local_70;
  
  if (comm->m_size == 1) {
    lVar15 = (long)end._M_current - (long)begin._M_current >> 3;
    if (0 < lVar15) {
      lVar15 = lVar15 + 1;
      lVar6 = 0;
      do {
        *(undefined4 *)((long)&(out._M_current)->first + lVar6) =
             *(undefined4 *)((long)&(begin._M_current)->first + lVar6);
        *(undefined4 *)((long)&(out._M_current)->second + lVar6) =
             *(undefined4 *)((long)&(begin._M_current)->second + lVar6);
        lVar15 = lVar15 + -1;
        lVar6 = lVar6 + 8;
      } while (1 < lVar15);
    }
  }
  else {
    local_90 = (pointer)((long)end._M_current - (long)begin._M_current >> 3);
    custom_op<unsigned_long>::custom_op<std::plus<unsigned_long>>(&local_70,1);
    MPI_Allreduce(&local_90,&local_88,1,local_70.m_type_copy,local_70.m_op,comm->mpi_comm);
    puVar11 = local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start;
    custom_op<unsigned_long>::~custom_op(&local_70);
    if (puVar11 != (pointer)0x0) {
      local_70._vptr_custom_op._0_4_ = (uint)(local_90 == puVar11);
      MPI_Allreduce(&local_70,&local_88,1,&ompi_mpi_int,&ompi_mpi_op_lor,comm->mpi_comm);
      if ((int)local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start == 0) {
        uVar7 = exscan<unsigned_long,std::plus<unsigned_long>>(&local_90,comm,1);
        local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_70,
                   (long)comm->m_size,(value_type_conflict2 *)&local_88,&local_91);
        uVar1 = comm->m_size;
        uVar2 = comm->m_rank;
        auVar3._8_8_ = 0;
        auVar3._0_8_ = puVar11;
        uVar8 = (ulong)puVar11 / (ulong)uVar1;
        uVar9 = SUB168(auVar3 % ZEXT416(uVar1),0);
        if (local_90 != (pointer)0x0) {
          uVar10 = uVar9 * (uVar8 + 1);
          if (uVar7 < uVar10) {
            iVar5 = (int)(uVar7 / (uVar8 + 1));
          }
          else {
            iVar5 = (int)((uVar7 - uVar10) / uVar8) + SUB164(auVar3 % ZEXT416(uVar1),0);
          }
          if (iVar5 < (int)uVar1) {
            uVar10 = (ulong)iVar5;
            puVar11 = local_90;
            do {
              uVar10 = uVar10 + 1;
              uVar13 = uVar10 & 0xffffffff;
              uVar14 = uVar13;
              if (uVar9 < uVar13) {
                uVar14 = uVar9;
              }
              puVar12 = (pointer)((uVar8 * uVar13 - uVar7) + uVar14);
              if (puVar11 < puVar12) {
                puVar12 = puVar11;
              }
              *(pointer *)
               (CONCAT44(local_70._vptr_custom_op._4_4_,(uint)local_70._vptr_custom_op) + -8 +
               uVar10 * 8) = puVar12;
              puVar11 = (pointer)((long)puVar11 - (long)puVar12);
            } while ((puVar11 != (pointer)0x0) &&
                    (uVar7 = uVar7 + (long)puVar12, (long)uVar10 < (long)(int)uVar1));
          }
        }
        all2all<unsigned_long>
                  (&local_88,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_70,comm
                  );
        if (local_90 == (pointer)0x0) {
          begin._M_current = (pair<int,_int> *)0x0;
        }
        if (uVar8 == -(ulong)(uVar2 < uVar9)) {
          out._M_current = (pair<int,_int> *)0x0;
        }
        all2allv<std::pair<int,int>>
                  (begin._M_current,
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_70,out._M_current
                   ,&local_88,comm);
        if (local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_88.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_88.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        pvVar4 = (void *)CONCAT44(local_70._vptr_custom_op._4_4_,(uint)local_70._vptr_custom_op);
        if (pvVar4 != (void *)0x0) {
          operator_delete(pvVar4,local_70.m_user_func.super__Function_base._M_functor._8_8_ -
                                 (long)pvVar4);
        }
      }
      else {
        impl::
        distribute_scatter<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
                  (begin,end,out,(size_t)puVar11,comm);
      }
    }
  }
  return;
}

Assistant:

void stable_distribute(_InIterator begin, _InIterator end, _OutIterator out, const mxx::comm& comm) {
    // if there's only one process, return a copy
    if (comm.size() == 1) {
        std::copy(begin, end, out);
        return;
    }

    // get local and global size
    size_t local_size = std::distance(begin, end);
    size_t total_size = mxx::allreduce(local_size, comm);

    if (total_size == 0) {
        return;
    }

    // one process has all elements -> use scatter instead of all2all
    if (mxx::any_of(local_size == total_size, comm)) {
        impl::distribute_scatter(begin, end, out, total_size, comm);
    } else {
        // get prefix sum of size and total size
        size_t prefix = mxx::exscan(local_size, comm);

        // calculate where to send elements
        // if there are any elements to send
        std::vector<size_t> send_counts(comm.size(), 0);
        blk_dist part(total_size, comm);
        if (local_size > 0) {
          int first_p = part.rank_of(prefix);
          size_t left_to_send = local_size;
          for (; left_to_send > 0 && first_p < comm.size(); ++first_p) {
              size_t nsend = std::min<size_t>(part.iprefix_size(first_p) - prefix, left_to_send);
              send_counts[first_p] = nsend;
              left_to_send -= nsend;
              prefix += nsend;
          }
        }
        std::vector<size_t> recv_counts = mxx::all2all(send_counts, comm);
        // TODO: accept iterators in mxx::all2all?
        using SendType = typename std::iterator_traits<_InIterator>::value_type;
        using RecvType = typename std::iterator_traits<_OutIterator>::value_type;
        const SendType* send_buf = (local_size > 0) ? &(*begin) : nullptr;
        RecvType* recv_buf = (part.local_size() > 0) ? &(*out) : nullptr;
        mxx::all2allv(send_buf, send_counts, recv_buf, recv_counts, comm);
    }
}